

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O2

int __thiscall
flow::BasicBlock::verify
          (BasicBlock *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  undefined7 extraout_var_06;
  long lVar4;
  char *this_00;
  _Iter_pred<flow::BasicBlock::verify()::__0> *p_Var5;
  long lVar6;
  _Iter_pred<flow::BasicBlock::verify()::__0> *this_01;
  _Iter_pred<flow::BasicBlock::verify()::__0> *p_Var7;
  string_view format_str;
  char *pcStack_60;
  string local_50;
  undefined8 uVar3;
  undefined7 extraout_var_01;
  
  this_01 = (_Iter_pred<flow::BasicBlock::verify()::__0> *)
            (this->code_).
            super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var5 = (_Iter_pred<flow::BasicBlock::verify()::__0> *)
           (this->code_).
           super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var5 == this_01) {
    this_00 = "BasicBlock {}: verify: Must contain at least one instruction.";
    pcStack_60 = (char *)0x3d;
    goto LAB_00135642;
  }
  bVar1 = isComplete(this);
  uVar3 = CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    this_00 = "BasicBlock {}: verify: Last instruction must be a terminator instruction.";
    pcStack_60 = (char *)0x49;
    goto LAB_00135642;
  }
  p_Var5 = p_Var5 + -8;
  lVar6 = (long)p_Var5 - (long)this_01;
  for (lVar4 = lVar6 >> 5; p_Var7 = this_01, 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar1 = __gnu_cxx::__ops::_Iter_pred<flow::BasicBlock::verify()::$_0>::operator()
                      (this_01,(__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                                )ctx);
    iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
    if (bVar1) goto LAB_001355d6;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<flow::BasicBlock::verify()::$_0>::operator()
                      (this_01 + 8,
                       (__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                        )ctx);
    iVar2 = (int)CONCAT71(extraout_var_01,bVar1);
    p_Var7 = this_01 + 8;
    if (bVar1) goto LAB_001355d6;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<flow::BasicBlock::verify()::$_0>::operator()
                      (this_01 + 0x10,
                       (__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                        )ctx);
    iVar2 = (int)CONCAT71(extraout_var_02,bVar1);
    p_Var7 = this_01 + 0x10;
    if (bVar1) goto LAB_001355d6;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<flow::BasicBlock::verify()::$_0>::operator()
                      (this_01 + 0x18,
                       (__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                        )ctx);
    uVar3 = CONCAT71(extraout_var_03,bVar1);
    iVar2 = (int)uVar3;
    p_Var7 = this_01 + 0x18;
    if (bVar1) goto LAB_001355d6;
    this_01 = this_01 + 0x20;
    lVar6 = lVar6 + -0x20;
  }
  lVar6 = lVar6 >> 3;
  if (lVar6 == 1) {
LAB_001355c5:
    bVar1 = __gnu_cxx::__ops::_Iter_pred<flow::BasicBlock::verify()::$_0>::operator()
                      (this_01,(__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                                )ctx);
    iVar2 = (int)CONCAT71(extraout_var_06,bVar1);
    p_Var7 = this_01;
    if (!bVar1) {
      p_Var7 = p_Var5;
    }
  }
  else if (lVar6 == 2) {
LAB_001355b5:
    bVar1 = __gnu_cxx::__ops::_Iter_pred<flow::BasicBlock::verify()::$_0>::operator()
                      (this_01,(__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                                )ctx);
    iVar2 = (int)CONCAT71(extraout_var_05,bVar1);
    p_Var7 = this_01;
    if (!bVar1) {
      this_01 = this_01 + 8;
      goto LAB_001355c5;
    }
  }
  else {
    if (lVar6 != 3) {
      return (int)uVar3;
    }
    bVar1 = __gnu_cxx::__ops::_Iter_pred<flow::BasicBlock::verify()::$_0>::operator()
                      (this_01,(__normal_iterator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_*,_std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                                )ctx);
    iVar2 = (int)CONCAT71(extraout_var_04,bVar1);
    if (!bVar1) {
      this_01 = this_01 + 8;
      goto LAB_001355b5;
    }
  }
LAB_001355d6:
  if (p_Var7 == p_Var5) {
    return iVar2;
  }
  this_00 = "BasicBlock {}: verify: Found a terminate instruction in the middle of the block.";
  pcStack_60 = (char *)0x50;
LAB_00135642:
  __stream = _stderr;
  format_str.size_ = (size_t)&(this->super_Value).name_;
  format_str.data_ = pcStack_60;
  fmt::v5::format<std::__cxx11::string>
            (&local_50,(v5 *)this_00,format_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tbs);
  fprintf(__stream,"%s\n",local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  abort();
}

Assistant:

void BasicBlock::verify() {
  FLOW_ASSERT(code_.size() > 0, fmt::format("BasicBlock {}: verify: Must contain at least one instruction.", name()));
  FLOW_ASSERT(isComplete(), fmt::format("BasicBlock {}: verify: Last instruction must be a terminator instruction.", name()));
  FLOW_ASSERT(
      std::find_if(code_.begin(), std::prev(code_.end()), [&](std::unique_ptr<Instr>& instr) -> bool {
        return dynamic_cast<TerminateInstr*>(instr.get()) != nullptr;
      }) == std::prev(code_.end()),
      fmt::format("BasicBlock {}: verify: Found a terminate instruction in the middle of the block.", name()));
}